

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O1

void * qmemrchr(void *s,int needle,size_t size)

{
  size_t sVar1;
  long lVar2;
  
  do {
    if (size == 0) {
      return (void *)0x0;
    }
    sVar1 = size - 1;
    lVar2 = size - 1;
    size = sVar1;
  } while (*(char *)((long)s + lVar2) != (char)needle);
  return (void *)((long)s + sVar1);
}

Assistant:

const void *qmemrchr(const void *s, int needle, size_t size) noexcept
{
#if QT_CONFIG(memrchr)
    return memrchr(s, needle, size);
#endif
    auto b = static_cast<const uchar *>(s);
    const uchar *n = b + size;
    while (n-- != b) {
        if (*n == uchar(needle))
            return n;
    }
    return nullptr;
}